

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

PoolingLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_pooling(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x78) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x78;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.pooling_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::PoolingLayerParams>
                   (arena);
    (this->layer_).pooling_ = (PoolingLayerParams *)LVar2;
  }
  return (PoolingLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::PoolingLayerParams* NeuralNetworkLayer::_internal_mutable_pooling() {
  if (!_internal_has_pooling()) {
    clear_layer();
    set_has_pooling();
    layer_.pooling_ = CreateMaybeMessage< ::CoreML::Specification::PoolingLayerParams >(GetArenaForAllocation());
  }
  return layer_.pooling_;
}